

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<std::pair<int,int>,unsigned_int_const&,unsigned_int_const&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,pair<int,_int> *args,
          uint *args_1,uint *args_2)

{
  format_args args_00;
  string_view fmt_00;
  char *pcVar1;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t in_RDI;
  undefined8 in_R8;
  undefined4 *in_R9;
  undefined4 *in_stack_00000020;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab8;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffac0;
  undefined8 uVar2;
  logger *in_stack_fffffffffffffac8;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffad0;
  basic_appender<char> *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffb08;
  level_enum in_stack_fffffffffffffb2c;
  log_msg *in_stack_fffffffffffffb30;
  string_view_t in_stack_fffffffffffffb38;
  string_view_t in_stack_fffffffffffffb48;
  source_loc in_stack_fffffffffffffb60;
  basic_string_view<char> local_448 [2];
  undefined8 local_428;
  undefined8 uStack_420;
  log_msg *local_418;
  buffer<char> *local_3b0;
  value<fmt::v11::context> local_3a8;
  undefined4 local_398 [4];
  undefined4 local_388 [6];
  undefined8 local_370;
  value<fmt::v11::context> *local_368;
  undefined8 local_360;
  undefined8 local_358;
  basic_appender<char> local_350 [4];
  buffer<char> local_330 [9];
  undefined1 local_20a;
  byte local_209;
  undefined4 *local_208;
  undefined8 local_200;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined4 *local_110;
  undefined4 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  value<fmt::v11::context> *local_f0;
  undefined4 local_e4;
  undefined4 *local_e0;
  undefined4 local_d4;
  undefined4 *local_d0;
  value<fmt::v11::context> *local_c8;
  undefined8 *local_c0;
  
  pcVar1 = &stack0x00000008;
  local_208 = in_R9;
  local_200 = in_R8;
  local_1e8 = in_RDX;
  local_1e0 = in_RCX;
  local_209 = should_log(in_stack_fffffffffffffac8,
                         (level_enum)((ulong)in_stack_fffffffffffffac0 >> 0x20));
  local_20a = details::backtracer::enabled((backtracer *)0x20169b);
  if (((local_209 & 1) != 0) || ((bool)local_20a)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffac0,(allocator<char> *)in_stack_fffffffffffffab8);
    ::fmt::v11::basic_appender<char>::basic_appender(local_350,local_330);
    local_360 = local_1e8;
    local_358 = local_1e0;
    local_100 = local_200;
    local_108 = local_208;
    local_110 = in_stack_00000020;
    local_f0 = &local_3a8;
    local_f8 = local_200;
    ::fmt::v11::detail::value<fmt::v11::context>::value<std::pair<int,_int>,_0>(local_f0,local_200);
    local_e0 = local_398;
    local_e4 = *local_108;
    local_d0 = local_388;
    local_d4 = *local_110;
    local_c0 = &local_370;
    local_c8 = &local_3a8;
    local_370 = 0x22f;
    fmt_00.size_ = in_RDI;
    fmt_00.data_ = pcVar1;
    args_00.desc_._4_4_ = in_stack_fffffffffffffb04;
    args_00.desc_._0_4_ = in_stack_fffffffffffffb00;
    args_00.field_1.values_ = in_stack_fffffffffffffb08.values_;
    local_398[0] = local_e4;
    local_388[0] = local_d4;
    local_368 = local_c8;
    local_3b0 = (buffer<char> *)
                ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                          (in_stack_fffffffffffffaf8,fmt_00,args_00);
    local_418 = *(log_msg **)(pcVar1 + 0x10);
    local_428 = *(undefined8 *)pcVar1;
    uStack_420 = *(undefined8 *)(pcVar1 + 8);
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    pcVar1 = ::fmt::v11::detail::buffer<char>::data(local_330);
    count = ::fmt::v11::detail::buffer<char>::size(local_330);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_448,pcVar1,count);
    uVar2 = uStack_420;
    log_msg_00 = local_418;
    details::log_msg::log_msg
              (in_stack_fffffffffffffb30,in_stack_fffffffffffffb60,in_stack_fffffffffffffb48,
               in_stack_fffffffffffffb2c,in_stack_fffffffffffffb38);
    log_it_(in_stack_fffffffffffffad0,log_msg_00,SUB81((ulong)uVar2 >> 0x38,0),
            SUB81((ulong)uVar2 >> 0x30,0));
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x20194f);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }